

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase289::run(TestCase289 *this)

{
  Reader *reader;
  ReaderOptions options;
  Array<capnp::word> local_1e0;
  undefined1 local_1b8 [8];
  Reader root;
  ArrayPtr<kj::ArrayPtr<const_capnp::word>_> local_170;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_160;
  undefined1 local_150 [8];
  SegmentArrayMessageReader upgraded;
  undefined1 local_58 [8];
  ArrayPtr<const_capnp::word> segments [1];
  AlignedData<7> upgradedList;
  TestCase289 *this_local;
  
  segments[0].size_ = 0x4000000000000;
  join_0x00000010_0x00000000_ = kj::arrayPtr<capnp::word>((word *)&segments[0].size_,7);
  _local_58 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&upgraded.segments.size_);
  local_170 = kj::arrayPtr<kj::ArrayPtr<capnp::word_const>>
                        ((ArrayPtr<const_capnp::word> *)local_58,1);
  local_160 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_170);
  root._reader.nestingLimit = 0;
  root._reader._44_4_ = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&root._reader.nestingLimit);
  options._8_8_ = 0;
  options.traversalLimitInWords = root._reader._40_8_;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_150,local_160,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestLists>
            ((Reader *)local_1b8,(MessageReader *)local_150);
  canonicalize<capnproto_test::capnp::test::TestLists::Reader&>
            (&local_1e0,(capnp *)local_1b8,reader);
  kj::Array<capnp::word>::~Array(&local_1e0);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_150);
  return;
}

Assistant:

TEST(WireFormat, StructRoundTrip_OneSegment) {
  MallocMessageBuilder message;
  BuilderArena arena(&message);
  auto allocation = arena.allocate(1 * WORDS);
  SegmentBuilder* segment = allocation.segment;
  word* rootLocation = allocation.words;

  StructBuilder builder = PointerBuilder::getRoot(segment, nullptr, rootLocation)
      .initStruct(StructSize(2 * WORDS, 4 * POINTERS));
  setupStruct(builder);

  // word count:
  //    1  root pointer
  //    6  root struct
  //    1  sub message
  //    2  3-element int32 list
  //   13  struct list
  //         1 tag
  //        12 4x struct
  //           1 data section
  //           1 pointer section
  //           1 sub-struct
  //   11  list list
  //         5 pointers to sub-lists
  //         6 sub-lists (4x 1 word, 1x 2 words)
  // -----
  //   34
  kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = arena.getSegmentsForOutput();
  ASSERT_EQ(1u, segments.size());
  EXPECT_EQ(34u, segments[0].size());

  checkStruct(builder);
  checkStruct(builder.asReader());
  checkStruct(PointerReader::getRootUnchecked(segment->getStartPtr()).getStruct(nullptr));
  checkStruct(PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), 4)
      .getStruct(nullptr));
}